

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O2

REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  REF_INT new_cell;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)ref_cell->node_per;
  if (ref_cell->node_per < 1) {
    uVar3 = uVar4;
  }
  bVar6 = false;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = !bVar6;
    bVar6 = true;
    if (bVar1) {
      bVar6 = ref_node->ref_mpi->id == ref_node->part[nodes[uVar4]];
    }
  }
  uVar5 = 0;
  if (bVar6) {
    uVar2 = ref_cell_add(ref_cell,nodes,&new_cell);
    uVar5 = 0;
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x1c6
             ,"ref_shard_cell_add_local",(ulong)uVar2,"add");
      uVar5 = uVar2;
    }
  }
  return uVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_cell_add_local(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes) {
  REF_BOOL has_local;
  REF_INT node, new_cell;

  has_local = REF_FALSE;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    has_local = has_local || (ref_mpi_rank(ref_node_mpi(ref_node)) ==
                              ref_node_part(ref_node, nodes[node]));

  if (has_local) RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add");

  return REF_SUCCESS;
}